

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

uint32 __thiscall Clasp::Solver::estimateBCP(Solver *this,Literal *p,int rd)

{
  Assignment *out;
  uint *puVar1;
  uint uVar2;
  size_type sVar3;
  Literal p_00;
  SharedContext *pSVar4;
  pointer pLVar5;
  pointer puVar6;
  bool bVar7;
  uint32 uVar8;
  size_type sVar9;
  
  uVar2 = p->rep_;
  if ((*(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar2 & 0xfffffffc)) & 3) != 0) {
    return 0;
  }
  out = &this->assign_;
  sVar3 = (this->assign_).trail.ebo_.size;
  puVar1 = (this->assign_).assign_.ebo_.buf + (uVar2 >> 2);
  *puVar1 = *puVar1 | 2 - ((uVar2 & 2) == 0);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(&out->trail,p);
  pSVar4 = this->shared_;
  uVar2 = (pSVar4->btig_).graph_.ebo_.size;
  sVar9 = sVar3;
  while ((p_00.rep_ = (out->trail).ebo_.buf[sVar9].rep_, uVar2 <= p_00.rep_ >> 1 ||
         (bVar7 = ShortImplicationsGraph::propagateBin(&pSVar4->btig_,out,p_00,0), bVar7))) {
    sVar9 = sVar9 + 1;
    bVar7 = rd == 0;
    rd = rd + -1;
    if (((this->assign_).trail.ebo_.size <= sVar9) || (bVar7)) break;
  }
  sVar9 = (this->assign_).trail.ebo_.size;
  uVar8 = sVar9 - sVar3;
  if (uVar8 == 0) {
    return 0;
  }
  pLVar5 = (this->assign_).trail.ebo_.buf;
  puVar6 = (this->assign_).assign_.ebo_.buf;
  do {
    *(undefined4 *)((long)puVar6 + (ulong)(pLVar5[sVar9 - 1].rep_ & 0xfffffffc)) = 0;
    sVar9 = (this->assign_).trail.ebo_.size - 1;
    (this->assign_).trail.ebo_.size = sVar9;
  } while (sVar9 != sVar3);
  return uVar8;
}

Assistant:

uint32 Solver::estimateBCP(const Literal& p, int rd) const {
	if (value(p.var()) != value_free) return 0;
	LitVec::size_type first = assign_.assigned();
	LitVec::size_type i     = first;
	Solver& self            = const_cast<Solver&>(*this);
	self.assign_.setValue(p.var(), trueValue(p));
	self.assign_.trail.push_back(p);
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	do {
		Literal x = assign_.trail[i++];
		if (x.id() < maxIdx && !btig.propagateBin(self.assign_, x, 0)) {
			break;
		}
	} while (i < assign_.assigned() && rd-- != 0);
	i = assign_.assigned()-first;
	while (self.assign_.assigned() != first) {
		self.assign_.undoLast();
	}
	return (uint32)i;
}